

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiple_command_runner.cc
# Opt level: O0

bool __thiscall MultipleCommandRunner::Finished(MultipleCommandRunner *this)

{
  bool bVar1;
  uint uVar2;
  reference pvVar3;
  value_type *next;
  MultipleCommandRunner *this_local;
  
  uVar2 = (*this->command_runner_->_vptr_CommandRunner[2])();
  if ((uVar2 & 1) == 0) {
    this_local._7_1_ = false;
  }
  else {
    bVar1 = PreviousCommandFailed(this);
    if (bVar1) {
      this_local._7_1_ = true;
    }
    else {
      bVar1 = std::
              queue<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>,_std::deque<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>_>_>_>
              ::empty(&this->enqueued_commands_);
      if (bVar1) {
        this_local._7_1_ = true;
      }
      else {
        pvVar3 = std::
                 queue<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>,_std::deque<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>_>_>_>
                 ::front(&this->enqueued_commands_);
        (*this->command_runner_->_vptr_CommandRunner[4])(this->command_runner_,pvVar3);
        this->ignore_failures_for_current_command_ = (bool)(pvVar3->second & 1);
        std::
        queue<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>,_std::deque<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>_>_>_>
        ::pop(&this->enqueued_commands_);
        this_local._7_1_ = false;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool MultipleCommandRunner::Finished() {
  if (!command_runner_->Finished())
    return false;
  if (PreviousCommandFailed())
    return true;

  if (!enqueued_commands_.empty()) {
    const auto& next = enqueued_commands_.front();
    command_runner_->RunCommand(next.first);
    ignore_failures_for_current_command_ = next.second;
    enqueued_commands_.pop();
    return false;
  }

  return true;
}